

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O0

bool __thiscall Jupiter::HTTP::Server::Data::has(Data *this,string_view hostname,string_view name)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  Data *pDVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  reference this_00;
  pointer pHVar5;
  pointer pHVar6;
  vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
  *this_01;
  reference this_02;
  pointer pCVar7;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  __sv_type __y;
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  *content;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
  *__range3;
  unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_> *host;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
  *__range1;
  uint name_checksum;
  Data *this_local;
  string_view name_local;
  string_view hostname_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (Data *)name._M_len;
  rhs._M_len = hostname._M_str;
  name_local._M_str = (char *)hostname._M_len;
  uVar4 = calc_checksumi<unsigned_int,std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_string_view<char,_std::char_traits<char>_> *)&name_local._M_str);
  __end1 = std::
           vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ::begin(&this->m_hosts);
  host = (unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
          *)std::
            vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
            ::end(&this->m_hosts);
  do {
    bVar3 = __gnu_cxx::
            operator==<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>_>
                      (&__end1,(__normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>_>
                                *)&host);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      return false;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>_>
              ::operator*(&__end1);
    pHVar5 = std::
             unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             ::operator->(this_00);
    if (uVar4 == (pHVar5->super_Directory).name_checksum) {
      pHVar6 = std::
               unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
               ::operator->(this_00);
      rhs._M_str = (char *)pHVar5;
      bVar3 = jessilib::equalsi<char,char>
                        ((jessilib *)&(pHVar6->super_Directory).name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         name_local._M_str,rhs);
      if (bVar3) {
        uVar4 = calc_checksum<unsigned_int,std::basic_string_view<char,std::char_traits<char>>>
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        pHVar5 = std::
                 unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
                 ::operator->(this_00);
        this_01 = &(pHVar5->super_Directory).content;
        __end3 = std::
                 vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
                 ::begin(this_01);
        content = (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                   *)std::
                     vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
                     ::end(this_01);
        do {
          bVar3 = __gnu_cxx::
                  operator==<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>_>
                            (&__end3,(__normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>_>
                                      *)&content);
          if (((bVar3 ^ 0xffU) & 1) == 0) {
            return false;
          }
          this_02 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>_>
                    ::operator*(&__end3);
          pCVar7 = std::
                   unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                   ::operator->(this_02);
          sVar2 = name_local._M_len;
          pDVar1 = this_local;
          if (uVar4 == pCVar7->name_checksum) {
            pCVar7 = std::
                     unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                     ::operator->(this_02);
            __y = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pCVar7->name);
            __x._M_str = (char *)sVar2;
            __x._M_len = (size_t)pDVar1;
            bVar3 = std::operator==(__x,__y);
            if (bVar3) {
              return true;
            }
          }
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>_>
          ::operator++(&__end3);
        } while( true );
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool Jupiter::HTTP::Server::Data::has(std::string_view hostname, std::string_view name) {
	unsigned int name_checksum = calc_checksumi(hostname);
	for (const auto& host : m_hosts) {
		if (name_checksum == host->name_checksum && jessilib::equalsi(host->name, hostname)) {
			name_checksum = calc_checksum(name); // switch to equalsi to make case-insensitive
			for (const auto& content : host->content) {
				if (name_checksum == content->name_checksum && content->name == name) { // switch to equalsi to make case-insensitive
					return true;
				}
			}
			return false;
		}
	}
	return false;
}